

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void blend_untransformed_argb(int count,QT_FT_Span *spans,void *userData)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  QThreadPool *pQVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar12;
  long lVar13;
  int iVar14;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  Operator op;
  undefined1 *local_120;
  Operator *local_118;
  QT_FT_Span *pQStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_f8;
  undefined4 uStack_f4;
  long *plStack_f0;
  Operator local_e8;
  long local_38;
  uint uVar11;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)((long)userData + 0xd0) | 2) != 6) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      blend_untransformed_generic(count,spans,userData);
      return;
    }
    goto LAB_00665e1c;
  }
  memcpy(&local_e8,&DAT_006dea50,0xb0);
  getOperator(&local_e8,(QSpanData *)userData,spans,count);
  local_108 = CONCAT44(-(int)((double)((ulong)-*(double *)((long)userData + 0x78) &
                                       0x8000000000000000 | 0x3fe0000000000000) -
                             *(double *)((long)userData + 0x78)),
                       -(int)((double)((ulong)-*(double *)((long)userData + 0x70) &
                                       0x8000000000000000 | 0x3fe0000000000000) -
                             *(double *)((long)userData + 0x70)));
  uStack_100 = CONCAT44((int)*(undefined8 *)((long)userData + 0xb0),
                        (int)((ulong)*(undefined8 *)((long)userData + 0xb0) >> 0x20));
  _local_f8 = CONCAT44(0xaaaaaaaa,*(undefined4 *)((long)userData + 0xe8));
  iVar10 = count + 0x5f;
  if (-1 < count + 0x20) {
    iVar10 = count + 0x20;
  }
  local_118 = &local_e8;
  pQStack_110 = spans;
  plStack_f0 = (long *)userData;
  pQVar4 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((count < 0x60) || (pQVar4 == (QThreadPool *)0x0)) ||
     ((int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp < 3)) {
LAB_00665bf2:
    if (0 < count) {
      lVar13 = 0;
      do {
        iVar10 = *(int *)((long)&pQStack_110->len + lVar13);
        if (((iVar10 != 0) &&
            (uVar8 = *(int *)((long)&pQStack_110->y + lVar13) + local_108._4_4_, -1 < (int)uVar8))
           && ((int)uVar8 < (int)uStack_100)) {
          iVar3 = *(int *)((long)&pQStack_110->x + lVar13);
          uVar1 = (int)local_108 + iVar3;
          if ((int)uVar1 < uStack_100._4_4_) {
            uVar9 = 0;
            if (0 < (int)uVar1) {
              uVar9 = (ulong)uVar1;
            }
            uVar11 = 0;
            if ((int)uVar1 < 0) {
              uVar11 = uVar1;
            }
            iVar10 = uVar11 + iVar10;
            iVar12 = uStack_100._4_4_ - (int)uVar9;
            if (iVar10 + (int)uVar9 <= uStack_100._4_4_) {
              iVar12 = iVar10;
            }
            if (0 < iVar12) {
              if ((int)uVar1 < 0) {
                iVar3 = -(int)local_108;
              }
              (*local_118->func)((uint *)((long)*(int *)((long)&pQStack_110->y + lVar13) *
                                          *(long *)(*plStack_f0 + 0x28) +
                                          *(long *)(*plStack_f0 + 0x38) + (long)iVar3 * 4),
                                 (uint *)((ulong)uVar8 * plStack_f0[0x19] + plStack_f0[0x15] +
                                         uVar9 * 4),iVar12,
                                 (int)((uint)(&pQStack_110->coverage)[lVar13] * local_f8) >> 8);
            }
          }
        }
        lVar13 = lVar13 + 0x10;
      } while ((ulong)(uint)count << 4 != lVar13);
    }
  }
  else {
    QThread::currentThread();
    cVar2 = QThreadPool::contains((QThread *)pQVar4);
    if (cVar2 != '\0') goto LAB_00665bf2;
    iVar10 = iVar10 >> 6;
    local_120 = &DAT_aaaaaaaaaaaaaaaa;
    iVar12 = 0;
    QSemaphore::QSemaphore((QSemaphore *)&local_120,0);
    iVar3 = 1;
    if (1 < iVar10) {
      iVar3 = iVar10;
    }
    iVar14 = 0;
    do {
      iVar7 = (count - iVar14) / (iVar12 + iVar10);
      puVar5 = (undefined8 *)operator_new(0x18);
      *(undefined1 *)(puVar5 + 1) = 1;
      *puVar5 = QFactoryLoader::keyMap;
      puVar6 = (undefined8 *)operator_new(0x20);
      *puVar6 = QRunnable::QGenericRunnable::
                Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4572:5)>
                ::impl;
      *(int *)(puVar6 + 1) = iVar14;
      *(int *)((long)puVar6 + 0xc) = iVar7;
      puVar6[2] = &local_118;
      puVar6[3] = &local_120;
      puVar5[2] = puVar6;
      QThreadPool::start((QRunnable *)pQVar4,(int)puVar5);
      iVar14 = iVar14 + iVar7;
      iVar12 = iVar12 + -1;
    } while (-iVar3 != iVar12);
    QSemaphore::acquire((int)(QSemaphore *)&local_120);
    QSemaphore::~QSemaphore((QSemaphore *)&local_120);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00665e1c:
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    if (data->texture.format != QImage::Format_ARGB32_Premultiplied
        && data->texture.format != QImage::Format_RGB32) {
        blend_untransformed_generic(count, spans, userData);
        return;
    }

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    const int const_alpha = data->texture.const_alpha;
    const int xoff = -qRound(-data->dx);
    const int yoff = -qRound(-data->dy);

    auto function = [=, &op] (int cStart, int cEnd)
    {
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    const int coverage = (spans[c].coverage * const_alpha) >> 8;
                    const uint *src = (const uint *)data->texture.scanLine(sy) + sx;
                    uint *dest = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + x;
                    op.func(dest, src, length, coverage);
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}